

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O2

void __thiscall ExprTest_TooFewBreakpoints_Test::TestBody(ExprTest_TooFewBreakpoints_Test *this)

{
  PLTermBuilder builder_00;
  bool bVar1;
  Reference arg;
  ExprFactory *this_00;
  char *message;
  AssertHelper local_60;
  AssertionResult gtest_ar;
  string gtest_expected_message;
  PLTermBuilder builder;
  
  this_00 = &(this->super_ExprTest).factory_;
  builder = mp::BasicExprFactory<std::allocator<char>_>::BeginPLTerm(this_00,1);
  mp::BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddSlope(&builder,0.0);
  mp::BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddSlope(&builder,1.0);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_expected_message,"too few breakpoints",(allocator<char> *)&local_60)
    ;
    bVar1 = testing::internal::AlwaysTrue();
    builder_00 = builder;
    if (bVar1) {
      arg = mp::BasicExprFactory<std::allocator<char>_>::MakeVariable(this_00,0);
      mp::BasicExprFactory<std::allocator<char>_>::EndPLTerm(this_00,builder_00,arg);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [139])
               "Expected: factory_.EndPLTerm(builder, factory_.MakeVariable(0)) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    message = "";
  }
  else {
    message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_60,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x125,
             message);
  testing::internal::AssertHelper::operator=(&local_60,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&local_60);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(ExprTest, TooFewBreakpoints) {
  auto builder = factory_.BeginPLTerm(1);
  builder.AddSlope(0);
  builder.AddSlope(1);
  EXPECT_ASSERT(factory_.EndPLTerm(builder, factory_.MakeVariable(0)),
                "too few breakpoints");
}